

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O3

void create_needed_dirs(void)

{
  _Bool _Var1;
  char dirpath [512];
  char acStack_208 [512];
  
  path_build(acStack_208,0x200,ANGBAND_DIR_USER,"");
  _Var1 = dir_create(acStack_208);
  if (!_Var1) {
    quit_fmt("Cannot create \'%s\'",acStack_208);
  }
  path_build(acStack_208,0x200,ANGBAND_DIR_SAVE,"");
  _Var1 = dir_create(acStack_208);
  if (!_Var1) {
    quit_fmt("Cannot create \'%s\'",acStack_208);
  }
  path_build(acStack_208,0x200,ANGBAND_DIR_PANIC,"");
  _Var1 = dir_create(acStack_208);
  if (!_Var1) {
    quit_fmt("Cannot create \'%s\'",acStack_208);
  }
  path_build(acStack_208,0x200,ANGBAND_DIR_SCORES,"");
  _Var1 = dir_create(acStack_208);
  if (!_Var1) {
    quit_fmt("Cannot create \'%s\'",acStack_208);
  }
  path_build(acStack_208,0x200,ANGBAND_DIR_ARCHIVE,"");
  _Var1 = dir_create(acStack_208);
  if (!_Var1) {
    quit_fmt("Cannot create \'%s\'",acStack_208);
  }
  path_build(acStack_208,0x200,ANGBAND_DIR_BONE,"");
  _Var1 = dir_create(acStack_208);
  if (!_Var1) {
    quit_fmt("Cannot create \'%s\'",acStack_208);
  }
  return;
}

Assistant:

void create_needed_dirs(void)
{
	char dirpath[512];

	path_build(dirpath, sizeof(dirpath), ANGBAND_DIR_USER, "");
	if (!dir_create(dirpath)) quit_fmt("Cannot create '%s'", dirpath);

	path_build(dirpath, sizeof(dirpath), ANGBAND_DIR_SAVE, "");
	if (!dir_create(dirpath)) quit_fmt("Cannot create '%s'", dirpath);

	path_build(dirpath, sizeof(dirpath), ANGBAND_DIR_PANIC, "");
	if (!dir_create(dirpath)) quit_fmt("Cannot create '%s'", dirpath);

	path_build(dirpath, sizeof(dirpath), ANGBAND_DIR_SCORES, "");
	if (!dir_create(dirpath)) quit_fmt("Cannot create '%s'", dirpath);

	path_build(dirpath, sizeof(dirpath), ANGBAND_DIR_ARCHIVE, "");
	if (!dir_create(dirpath)) quit_fmt("Cannot create '%s'", dirpath);

	path_build(dirpath, sizeof(dirpath), ANGBAND_DIR_BONE, "");
	if (!dir_create(dirpath)) quit_fmt("Cannot create '%s'", dirpath);
}